

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_processing_impl.h
# Opt level: O1

void __thiscall
webrtc::AudioProcessingImpl::ApmCaptureState::~ApmCaptureState(ApmCaptureState *this)

{
  AudioBuffer *pAVar1;
  pointer pCVar2;
  
  pAVar1 = (this->capture_audio)._M_t.
           super___uniq_ptr_impl<webrtc::AudioBuffer,_std::default_delete<webrtc::AudioBuffer>_>.
           _M_t.
           super__Tuple_impl<0UL,_webrtc::AudioBuffer_*,_std::default_delete<webrtc::AudioBuffer>_>.
           super__Head_base<0UL,_webrtc::AudioBuffer_*,_false>._M_head_impl;
  if (pAVar1 != (AudioBuffer *)0x0) {
    (*pAVar1->_vptr_AudioBuffer[1])();
  }
  (this->capture_audio)._M_t.
  super___uniq_ptr_impl<webrtc::AudioBuffer,_std::default_delete<webrtc::AudioBuffer>_>._M_t.
  super__Tuple_impl<0UL,_webrtc::AudioBuffer_*,_std::default_delete<webrtc::AudioBuffer>_>.
  super__Head_base<0UL,_webrtc::AudioBuffer_*,_false>._M_head_impl = (AudioBuffer *)0x0;
  pCVar2 = (this->array_geometry).
           super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pCVar2 != (pointer)0x0) {
    operator_delete(pCVar2);
    return;
  }
  return;
}

Assistant:

ApmCaptureState(bool transient_suppressor_enabled,
                    const std::vector<Point>& array_geometry,
                    SphericalPointf target_direction)
        : aec_system_delay_jumps(-1),
          delay_offset_ms(0),
          was_stream_delay_set(false),
          last_stream_delay_ms(0),
          last_aec_system_delay_ms(0),
          stream_delay_jumps(-1),
          output_will_be_muted(false),
          key_pressed(false),
          transient_suppressor_enabled(transient_suppressor_enabled),
          array_geometry(array_geometry),
          target_direction(target_direction),
          fwd_proc_format(kSampleRate16kHz),
          split_rate(kSampleRate16kHz) {}